

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

void uv__print_handles(uv_loop_t *loop,int only_active,FILE *stream)

{
  uv_handle_t *h;
  QUEUE *q;
  char *type;
  FILE *stream_local;
  uv_loop_t *puStack_10;
  int only_active_local;
  uv_loop_t *loop_local;
  
  puStack_10 = loop;
  if (loop == (uv_loop_t *)0x0) {
    puStack_10 = uv_default_loop();
  }
  for (h = (uv_handle_t *)puStack_10->handle_queue[0]; h != (uv_handle_t *)puStack_10->handle_queue;
      h = (uv_handle_t *)h->data) {
    if ((only_active == 0) || (((h->u).fd & 4U) != 0)) {
      switch(*(undefined4 *)((long)&h[-1].u + 0x18)) {
      case 1:
        q = (QUEUE *)anon_var_dwarf_4e64;
        break;
      case 2:
        q = (QUEUE *)anon_var_dwarf_4e70;
        break;
      case 3:
        q = (QUEUE *)anon_var_dwarf_4e7c;
        break;
      case 4:
        q = (QUEUE *)anon_var_dwarf_4e88;
        break;
      case 5:
        q = (QUEUE *)0x12c24d;
        break;
      case 6:
        q = (QUEUE *)anon_var_dwarf_4ea0;
        break;
      case 7:
        q = (QUEUE *)0x12abc8;
        break;
      case 8:
        q = (QUEUE *)0x12ae54;
        break;
      case 9:
        q = (QUEUE *)anon_var_dwarf_4ed0;
        break;
      case 10:
        q = (QUEUE *)0x12ac7c;
        break;
      case 0xb:
        q = (QUEUE *)0x12ca22;
        break;
      case 0xc:
        q = (QUEUE *)anon_var_dwarf_4ef4;
        break;
      case 0xd:
        q = (QUEUE *)anon_var_dwarf_4f00;
        break;
      case 0xe:
        q = (QUEUE *)anon_var_dwarf_4f0c;
        break;
      case 0xf:
        q = (QUEUE *)anon_var_dwarf_4f18;
        break;
      case 0x10:
        q = (QUEUE *)anon_var_dwarf_4f24;
        break;
      default:
        q = (QUEUE *)anon_var_dwarf_4f30;
      }
      fprintf((FILE *)stream,"[%c%c%c] %-8s %p\n",
              (ulong)(uint)(int)"R-"[(int)(uint)((((h->u).fd & 8U) != 0 ^ 0xffU) & 1)],
              (ulong)(uint)(int)"A-"[(int)(uint)((((h->u).fd & 4U) != 0 ^ 0xffU) & 1)],
              (ulong)(uint)(int)"I-"[(int)(uint)((((h->u).fd & 0x10U) != 0 ^ 0xffU) & 1)],q,
              (undefined1 *)((long)&h[-1].u + 8));
    }
  }
  return;
}

Assistant:

static void uv__print_handles(uv_loop_t* loop, int only_active, FILE* stream) {
  const char* type;
  QUEUE* q;
  uv_handle_t* h;

  if (loop == NULL)
    loop = uv_default_loop();

  QUEUE_FOREACH(q, &loop->handle_queue) {
    h = QUEUE_DATA(q, uv_handle_t, handle_queue);

    if (only_active && !uv__is_active(h))
      continue;

    switch (h->type) {
#define X(uc, lc) case UV_##uc: type = #lc; break;
      UV_HANDLE_TYPE_MAP(X)
#undef X
      default: type = "<unknown>";
    }

    fprintf(stream,
            "[%c%c%c] %-8s %p\n",
            "R-"[!(h->flags & UV_HANDLE_REF)],
            "A-"[!(h->flags & UV_HANDLE_ACTIVE)],
            "I-"[!(h->flags & UV_HANDLE_INTERNAL)],
            type,
            (void*)h);
  }
}